

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Icon2.cxx
# Opt level: O3

int __thiscall Fl_File_Icon::load_image(Fl_File_Icon *this,char *ifile)

{
  char **ppcVar1;
  Fl_File_Icon *pFVar2;
  Fl_Color FVar3;
  byte bVar4;
  uint uVar5;
  Fl_Shared_Image *pFVar6;
  void *__s;
  char *pcVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  Fl_Color FVar13;
  long lVar14;
  ulong uVar15;
  byte bVar16;
  uint uVar17;
  byte *pbVar18;
  char **ppcVar19;
  Fl_Color c;
  int iVar20;
  char *pcVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  char val [16];
  int chars_per_color;
  int ncolors;
  uint local_8c;
  char local_68;
  char local_67;
  undefined1 local_66;
  ulong local_58;
  ulong local_50;
  Fl_Shared_Image *local_48;
  int local_40;
  int local_3c;
  Fl_File_Icon *local_38;
  
  local_38 = this;
  pFVar6 = Fl_Shared_Image::get(ifile,0,0);
  iVar8 = -1;
  if ((((pFVar6 != (Fl_Shared_Image *)0x0) &&
       (iVar22 = (pFVar6->super_Fl_Image).count_, iVar22 != 0)) &&
      (iVar10 = (pFVar6->super_Fl_Image).w_, iVar10 != 0)) &&
     (iVar24 = (pFVar6->super_Fl_Image).h_, iVar24 != 0)) {
    local_48 = pFVar6;
    if (iVar22 == 1) {
      iVar8 = (pFVar6->super_Fl_Image).ld_;
      if (iVar8 == 0) {
        local_50 = 0;
      }
      else {
        local_50 = (ulong)(iVar8 - iVar10 * (pFVar6->super_Fl_Image).d_);
      }
      if (0 < iVar24) {
        pbVar18 = (byte *)*(pFVar6->super_Fl_Image).data_;
        iVar8 = 0;
        do {
          iVar22 = (pFVar6->super_Fl_Image).w_;
          if (0 < iVar22) {
            local_58 = (ulong)(uint)(iVar8 * 9000);
            iVar9 = iVar8 * 9000 + 9000;
            iVar10 = (pFVar6->super_Fl_Image).d_;
            iVar26 = 0;
            c = 0xffffffff;
            iVar25 = 0;
            iVar24 = -1;
            do {
              pFVar2 = local_38;
              if (iVar10 == 3) {
LAB_0020b570:
                uVar17 = (uint)pbVar18[1];
                bVar16 = pbVar18[2];
                if ((pbVar18[1] == 0 && *pbVar18 == 0) && bVar16 == 0) {
LAB_0020b5b2:
                  FVar13 = 0x38;
                }
                else {
                  uVar12 = (uint)*pbVar18;
LAB_0020b5a6:
                  FVar13 = (uVar17 << 8 | uVar12 << 0x10 | (uint)bVar16) << 8;
                }
              }
              else if (iVar10 == 2) {
                FVar13 = 0xffffffff;
                if ((char)pbVar18[1] < '\0') goto LAB_0020b597;
              }
              else {
                if (iVar10 == 1) {
LAB_0020b597:
                  bVar16 = *pbVar18;
                  if (bVar16 == 0) goto LAB_0020b5b2;
                  uVar17 = (uint)bVar16;
                  uVar12 = uVar17;
                  goto LAB_0020b5a6;
                }
                FVar13 = 0xffffffff;
                if ((char)pbVar18[3] < '\0') goto LAB_0020b570;
              }
              iVar20 = iVar24 + 1;
              FVar3 = c;
              iVar23 = iVar25;
              if (((FVar13 != c) && (FVar3 = FVar13, iVar23 = iVar20, iVar25 < iVar20)) &&
                 (c != 0xffffffff)) {
                add_color(local_38,c);
                add(pFVar2,4);
                pFVar6 = local_48;
                add_vertex(pFVar2,(iVar25 * 9000) / (local_48->super_Fl_Image).w_ + 1000,
                           0x251c - (int)((long)((ulong)(uint)((int)local_58 >> 0x1f) << 0x20 |
                                                local_58 & 0xffffffff) /
                                         (long)(local_48->super_Fl_Image).h_));
                add_vertex(pFVar2,iVar26 / (pFVar6->super_Fl_Image).w_ + 1000,
                           0x251c - (int)((long)((ulong)(uint)((int)local_58 >> 0x1f) << 0x20 |
                                                local_58 & 0xffffffff) /
                                         (long)(pFVar6->super_Fl_Image).h_));
                add_vertex(pFVar2,iVar26 / (pFVar6->super_Fl_Image).w_ + 1000,
                           0x251c - iVar9 / (pFVar6->super_Fl_Image).h_);
                add_vertex(pFVar2,(iVar25 * 9000) / (pFVar6->super_Fl_Image).w_ + 1000,
                           0x251c - iVar9 / (pFVar6->super_Fl_Image).h_);
                add(pFVar2,0);
                iVar22 = (pFVar6->super_Fl_Image).w_;
                iVar10 = (pFVar6->super_Fl_Image).d_;
              }
              iVar25 = iVar23;
              c = FVar3;
              pFVar2 = local_38;
              pFVar6 = local_48;
              pbVar18 = pbVar18 + iVar10;
              iVar26 = iVar26 + 9000;
              iVar23 = iVar24 + 2;
              iVar24 = iVar20;
            } while (iVar23 < iVar22);
            if ((iVar25 <= iVar20) && (c != 0xffffffff)) {
              add_color(local_38,c);
              add(pFVar2,4);
              uVar15 = local_58;
              uVar12 = (int)local_58 >> 0x1f;
              add_vertex(pFVar2,(iVar25 * 9000) / (pFVar6->super_Fl_Image).w_ + 1000,
                         0x251c - (int)((long)((ulong)uVar12 << 0x20 | local_58 & 0xffffffff) /
                                       (long)(pFVar6->super_Fl_Image).h_));
              add_vertex(pFVar2,iVar26 / (pFVar6->super_Fl_Image).w_ + 1000,
                         0x251c - (int)((long)((ulong)uVar12 << 0x20 | uVar15 & 0xffffffff) /
                                       (long)(pFVar6->super_Fl_Image).h_));
              add_vertex(pFVar2,iVar26 / (pFVar6->super_Fl_Image).w_ + 1000,
                         0x251c - iVar9 / (pFVar6->super_Fl_Image).h_);
              add_vertex(pFVar2,(iVar25 * 9000) / (pFVar6->super_Fl_Image).w_ + 1000,
                         0x251c - iVar9 / (pFVar6->super_Fl_Image).h_);
              add(pFVar2,0);
            }
          }
          pbVar18 = pbVar18 + local_50;
          iVar8 = iVar8 + 1;
        } while (iVar8 < (pFVar6->super_Fl_Image).h_);
      }
    }
    else {
      ppcVar1 = (pFVar6->super_Fl_Image).data_;
      __isoc99_sscanf(*ppcVar1,"%*d%*d%d%d",&local_3c,&local_40);
      bVar16 = (char)local_40 << 3;
      __s = operator_new__((ulong)(uint)(4 << (bVar16 & 0x1f)));
      memset(__s,0,4L << (bVar16 & 0x3f));
      ppcVar19 = ppcVar1 + 1;
      if (local_3c < 0) {
        local_3c = -local_3c;
        pcVar7 = *ppcVar19;
        iVar8 = 1;
        if (1 < local_3c) {
          iVar8 = local_3c;
        }
        lVar11 = 0;
        do {
          if ((pcVar7[lVar11 * 4 + 2] == 0 && pcVar7[lVar11 * 4 + 1] == 0) &&
              pcVar7[lVar11 * 4 + 3] == 0) {
            iVar22 = 0x38;
          }
          else {
            iVar22 = ((uint)(byte)pcVar7[lVar11 * 4 + 2] << 8 |
                      (uint)(byte)pcVar7[lVar11 * 4 + 1] << 0x10 |
                     (uint)(byte)pcVar7[lVar11 * 4 + 3]) << 8;
          }
          *(int *)((long)__s + (ulong)(byte)pcVar7[lVar11 * 4] * 4) = iVar22;
          lVar11 = lVar11 + 1;
        } while (iVar8 != (int)lVar11);
        ppcVar19 = ppcVar1 + 2;
        local_8c = 0x20;
      }
      else {
        local_8c = 0x20;
        if (local_3c != 0) {
          iVar22 = 0;
          iVar8 = local_3c;
          do {
            pcVar7 = *ppcVar19;
            uVar12 = (uint)*pcVar7;
            if (local_40 < 2) {
              pcVar21 = pcVar7 + 1;
            }
            else {
              pcVar21 = pcVar7 + 2;
              uVar12 = uVar12 << 8 | (int)pcVar7[1];
            }
            pcVar7 = strstr(pcVar21,"c ");
            lVar11 = (long)(int)uVar12;
            if (pcVar7 == (char *)0x0) {
LAB_0020b2a5:
              *(undefined4 *)((long)__s + lVar11 * 4) = 0x38;
            }
            else if (pcVar7[2] == '#') {
              lVar14 = 0;
              do {
                iVar8 = isxdigit((int)pcVar7[lVar14 + 3]);
                if (iVar8 == 0) {
                  bVar16 = 0;
                  uVar17 = local_8c;
                  switch((int)lVar14) {
                  case 3:
                    local_68 = pcVar7[3];
                    local_67 = 0;
                    lVar14 = strtol(&local_68,(char **)0x0,0x10);
                    bVar16 = (char)((int)lVar14 << 4) + (char)lVar14;
                    local_68 = pcVar7[4];
                    local_67 = 0;
                    lVar14 = strtol(&local_68,(char **)0x0,0x10);
                    uVar5 = (int)lVar14 * 0x11;
                    local_68 = pcVar7[5];
                    local_67 = '\0';
                    lVar14 = strtol(&local_68,(char **)0x0,0x10);
                    bVar4 = (char)((int)lVar14 << 4) + (char)lVar14;
                    break;
                  case 4:
                  case 5:
                  case 7:
                  case 8:
                  case 10:
                  case 0xb:
                    goto switchD_0020b33c_caseD_4;
                  case 6:
                  case 9:
                  case 0xc:
                    goto switchD_0020b33c_caseD_6;
                  default:
                    uVar5 = 0;
                    bVar4 = 0;
                    uVar17 = uVar12;
                    if ((int)lVar14 != 0) break;
switchD_0020b33c_caseD_4:
                    local_8c = uVar17;
                    bVar16 = 0;
                    uVar5 = 0;
                    bVar4 = 0;
                  }
                  goto LAB_0020b3c7;
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 != 0xc);
              lVar14 = 0xc;
switchD_0020b33c_caseD_6:
              uVar15 = (ulong)(((uint)lVar14 & 0xff) / 3);
              local_68 = pcVar7[3];
              local_67 = pcVar7[4];
              local_66 = 0;
              lVar14 = strtol(&local_68,(char **)0x0,0x10);
              bVar16 = (byte)lVar14;
              local_68 = pcVar7[uVar15 + 3];
              local_67 = pcVar7[uVar15 + 4];
              local_66 = 0;
              lVar14 = strtol(&local_68,(char **)0x0,0x10);
              uVar5 = (uint)lVar14;
              local_68 = pcVar7[uVar15 * 2 + 3];
              local_67 = pcVar7[uVar15 * 2 + 4];
              local_66 = 0;
              lVar14 = strtol(&local_68,(char **)0x0,0x10);
              bVar4 = (byte)lVar14;
LAB_0020b3c7:
              if (((char)uVar5 == '\0' && bVar16 == 0) && bVar4 == 0) {
                iVar8 = 0x38;
              }
              else {
                iVar8 = ((uint)bVar4 | (uVar5 & 0xff) << 8 | (uint)bVar16 << 0x10) << 8;
              }
              *(int *)((long)__s + lVar11 * 4) = iVar8;
              iVar8 = local_3c;
            }
            else {
              pcVar7 = pcVar7 + 2;
              iVar10 = strncasecmp(pcVar7,"white",5);
              if (iVar10 == 0) {
                *(undefined4 *)((long)__s + lVar11 * 4) = 0xff;
              }
              else {
                iVar10 = strncasecmp(pcVar7,"black",5);
                if (iVar10 == 0) goto LAB_0020b2a5;
                iVar10 = strncasecmp(pcVar7,"none",4);
                if (iVar10 == 0) {
                  *(undefined4 *)((long)__s + lVar11 * 4) = 0x38;
                  local_8c = uVar12;
                }
                else {
                  *(undefined4 *)((long)__s + lVar11 * 4) = 0x31;
                }
              }
            }
            iVar22 = iVar22 + 1;
            ppcVar19 = ppcVar19 + 1;
          } while (iVar22 < iVar8);
        }
      }
      pFVar6 = local_48;
      if (0 < (local_48->super_Fl_Image).h_) {
        local_50 = local_50 & 0xffffffff00000000;
        do {
          iVar8 = (pFVar6->super_Fl_Image).w_;
          if (0 < iVar8) {
            pcVar7 = *ppcVar19;
            local_58 = (ulong)(uint)((int)local_50 * 9000);
            iVar10 = (int)local_50 * 9000 + 9000;
            iVar24 = 0;
            iVar9 = 0;
            uVar12 = local_8c;
            iVar22 = 0;
            do {
              pFVar2 = local_38;
              uVar17 = (uint)*pcVar7;
              if (local_40 < 2) {
                pcVar7 = pcVar7 + 1;
              }
              else {
                pcVar21 = pcVar7 + 1;
                pcVar7 = pcVar7 + 2;
                uVar17 = uVar17 << 8 | (int)*pcVar21;
              }
              uVar5 = uVar12;
              iVar25 = iVar22;
              if ((uVar17 != uVar12) && (uVar5 = uVar17, iVar25 = iVar9, uVar12 != local_8c)) {
                add_color(local_38,*(Fl_Color *)((long)__s + (long)(int)uVar12 * 4));
                add(pFVar2,4);
                pFVar6 = local_48;
                add_vertex(pFVar2,(iVar22 * 9000) / (local_48->super_Fl_Image).w_ + 1000,
                           0x251c - (int)((long)((ulong)(uint)((int)local_58 >> 0x1f) << 0x20 |
                                                local_58 & 0xffffffff) /
                                         (long)(local_48->super_Fl_Image).h_));
                add_vertex(pFVar2,iVar24 / (pFVar6->super_Fl_Image).w_ + 1000,
                           0x251c - (int)((long)((ulong)(uint)((int)local_58 >> 0x1f) << 0x20 |
                                                local_58 & 0xffffffff) /
                                         (long)(pFVar6->super_Fl_Image).h_));
                add_vertex(pFVar2,iVar24 / (pFVar6->super_Fl_Image).w_ + 1000,
                           0x251c - iVar10 / (pFVar6->super_Fl_Image).h_);
                add_vertex(pFVar2,(iVar22 * 9000) / (pFVar6->super_Fl_Image).w_ + 1000,
                           0x251c - iVar10 / (pFVar6->super_Fl_Image).h_);
                add(pFVar2,0);
                iVar8 = (pFVar6->super_Fl_Image).w_;
              }
              uVar12 = uVar5;
              pFVar2 = local_38;
              pFVar6 = local_48;
              iVar9 = iVar9 + 1;
              iVar24 = iVar24 + 9000;
              iVar22 = iVar25;
            } while (iVar9 < iVar8);
            if (uVar12 != local_8c) {
              add_color(local_38,*(Fl_Color *)((long)__s + (long)(int)uVar12 * 4));
              add(pFVar2,4);
              uVar15 = local_58;
              uVar12 = (int)local_58 >> 0x1f;
              add_vertex(pFVar2,(iVar25 * 9000) / (pFVar6->super_Fl_Image).w_ + 1000,
                         0x251c - (int)((long)((ulong)uVar12 << 0x20 | local_58 & 0xffffffff) /
                                       (long)(pFVar6->super_Fl_Image).h_));
              add_vertex(pFVar2,iVar24 / (pFVar6->super_Fl_Image).w_ + 1000,
                         0x251c - (int)((long)((ulong)uVar12 << 0x20 | uVar15 & 0xffffffff) /
                                       (long)(pFVar6->super_Fl_Image).h_));
              add_vertex(pFVar2,iVar24 / (pFVar6->super_Fl_Image).w_ + 1000,
                         0x251c - iVar10 / (pFVar6->super_Fl_Image).h_);
              add_vertex(pFVar2,(iVar25 * 9000) / (pFVar6->super_Fl_Image).w_ + 1000,
                         0x251c - iVar10 / (pFVar6->super_Fl_Image).h_);
              add(pFVar2,0);
            }
          }
          iVar8 = (int)local_50 + 1;
          ppcVar19 = ppcVar19 + 1;
          local_50 = CONCAT44(local_50._4_4_,iVar8);
        } while (iVar8 < (pFVar6->super_Fl_Image).h_);
      }
      operator_delete__(__s);
    }
    Fl_Shared_Image::release(pFVar6);
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int Fl_File_Icon::load_image(const char *ifile)	// I - File to read from
{
  Fl_Shared_Image	*img;		// Image file


  img = Fl_Shared_Image::get(ifile);
  if (!img || !img->count() || !img->w() || !img->h()) return -1;

  if (img->count() == 1) {
    int		x, y;		// X & Y in image
    int		startx;		// Starting X coord
    Fl_Color	c,		// Current color
		temp;		// Temporary color
    const uchar *row;		// Pointer into image

    const int extra_data = img->ld() ? (img->ld()-img->w()*img->d()) : 0;

    // Loop through grayscale or RGB image...
    for (y = 0, row = (const uchar *)(*(img->data())); y < img->h(); y ++, row += extra_data)
    {
      for (x = 0, startx = 0, c = (Fl_Color)-1;
           x < img->w();
	   x ++, row += img->d())
      {
	switch (img->d())
	{
          case 1 :
              temp = fl_rgb_color(row[0], row[0], row[0]);
	      break;
          case 2 :
	      if (row[1] > 127)
        	temp = fl_rgb_color(row[0], row[0], row[0]);
	      else
		temp = (Fl_Color)-1;
	      break;
	  case 3 :
              temp = fl_rgb_color(row[0], row[1], row[2]);
	      break;
	  default :
	      if (row[3] > 127)
        	temp = fl_rgb_color(row[0], row[1], row[2]);
	      else
		temp = (Fl_Color)-1;
	      break;
	}

	if (temp != c)
	{
	  if (x > startx && c != (Fl_Color)-1)
	  {
	    add_color(c);
	    add(POLYGON);
	    add_vertex(startx * 9000 / img->w() + 1000, 9500 - y * 9000 / img->h());
	    add_vertex(x * 9000 / img->w() + 1000,      9500 - y * 9000 / img->h());
	    add_vertex(x * 9000 / img->w() + 1000,      9500 - (y + 1) * 9000 / img->h());
	    add_vertex(startx * 9000 / img->w() + 1000, 9500 - (y + 1) * 9000 / img->h());
	    add(END);
	  }

          c      = temp;
	  startx = x;
	}
      }

      if (x > startx && c != (Fl_Color)-1)
      {
	add_color(c);
	add(POLYGON);
	add_vertex(startx * 9000 / img->w() + 1000, 9500 - y * 9000 / img->h());
	add_vertex(x * 9000 / img->w() + 1000,      9500 - y * 9000 / img->h());
	add_vertex(x * 9000 / img->w() + 1000,      9500 - (y + 1) * 9000 / img->h());
	add_vertex(startx * 9000 / img->w() + 1000, 9500 - (y + 1) * 9000 / img->h());
	add(END);
      }
    }
  } else {
    int		i, j;			// Looping vars
    int		ch;			// Current character
    int		newch;			// New character
    int		bg;			// Background color
    char	val[16];		// Color value
    const char	*lineptr,		// Pointer into line
		*const*ptr;		// Pointer into data array
    int		ncolors,		// Number of colors
		chars_per_color;	// Characters per color
    Fl_Color	*colors;		// Colors
    int		red, green, blue;	// Red, green, and blue values
    int		x, y;			// X & Y in image
    int		startx;			// Starting X coord

    // Get the pixmap data...
    ptr = img->data();
    sscanf(*ptr, "%*d%*d%d%d", &ncolors, &chars_per_color);

    colors = new Fl_Color[1 << (chars_per_color * 8)];

    // Read the colormap...
    memset(colors, 0, sizeof(Fl_Color) << (chars_per_color * 8));
    bg = ' ';

    ptr ++;

    if (ncolors < 0) {
      // Read compressed colormap...
      const uchar *cmapptr;

      ncolors = -ncolors;

      for (i = 0, cmapptr = (const uchar *)*ptr; i < ncolors; i ++, cmapptr += 4)
        colors[cmapptr[0]] = fl_rgb_color(cmapptr[1], cmapptr[2], cmapptr[3]);

      ptr ++;
    } else {
      for (i = 0; i < ncolors; i ++, ptr ++) {
	// Get the color's character
	lineptr = *ptr;
	ch      = *lineptr++;

        if (chars_per_color > 1) ch = (ch << 8) | *lineptr++;

	// Get the color value...
	if ((lineptr = strstr(lineptr, "c ")) == NULL) {
	  // No color; make this black...
	  colors[ch] = FL_BLACK;
	} else if (lineptr[2] == '#') {
	  // Read the RGB triplet...
	  lineptr += 3;
	  for (j = 0; j < 12; j ++)
            if (!isxdigit(lineptr[j]))
	      break;

	  switch (j) {
            case 0 :
		bg = ch;
	    default :
		red = green = blue = 0;
		break;

            case 3 :
		val[0] = lineptr[0];
		val[1] = '\0';
		red = 255 * strtol(val, NULL, 16) / 15;

		val[0] = lineptr[1];
		val[1] = '\0';
		green = 255 * strtol(val, NULL, 16) / 15;

		val[0] = lineptr[2];
		val[1] = '\0';
		blue = 255 * strtol(val, NULL, 16) / 15;
		break;

            case 6 :
            case 9 :
            case 12 :
		j /= 3;

		val[0] = lineptr[0];
		val[1] = lineptr[1];
		val[2] = '\0';
		red = strtol(val, NULL, 16);

		val[0] = lineptr[j + 0];
		val[1] = lineptr[j + 1];
		val[2] = '\0';
		green = strtol(val, NULL, 16);

		val[0] = lineptr[2 * j + 0];
		val[1] = lineptr[2 * j + 1];
		val[2] = '\0';
		blue = strtol(val, NULL, 16);
		break;
	  }

	  colors[ch] = fl_rgb_color((uchar)red, (uchar)green, (uchar)blue);
	} else {
	  // Read a color name...
	  if (strncasecmp(lineptr + 2, "white", 5) == 0) colors[ch] = FL_WHITE;
	  else if (strncasecmp(lineptr + 2, "black", 5) == 0) colors[ch] = FL_BLACK;
	  else if (strncasecmp(lineptr + 2, "none", 4) == 0) {
            colors[ch] = FL_BLACK;
	    bg = ch;
	  } else colors[ch] = FL_GRAY;
	}
      }
    }

    // Read the image data...
    for (y = 0; y < img->h(); y ++, ptr ++) {
      lineptr = *ptr;
      startx  = 0;
      ch      = bg;

      for (x = 0; x < img->w(); x ++) {
	newch = *lineptr++;

        if (chars_per_color > 1) newch = (newch << 8) | *lineptr++;

	if (newch != ch) {
	  if (ch != bg) {
            add_color(colors[ch]);
	    add(POLYGON);
	    add_vertex(startx * 9000 / img->w() + 1000, 9500 - y * 9000 / img->h());
	    add_vertex(x * 9000 / img->w() + 1000,      9500 - y * 9000 / img->h());
	    add_vertex(x * 9000 / img->w() + 1000,      9500 - (y + 1) * 9000 / img->h());
	    add_vertex(startx * 9000 / img->w() + 1000, 9500 - (y + 1) * 9000 / img->h());
	    add(END);
          }

	  ch     = newch;
	  startx = x;
	}
      }

      if (ch != bg) {
	add_color(colors[ch]);
	add(POLYGON);
	add_vertex(startx * 9000 / img->w() + 1000, 9500 - y * 9000 / img->h());
	add_vertex(x * 9000 / img->w() + 1000,      9500 - y * 9000 / img->h());
	add_vertex(x * 9000 / img->w() + 1000,      9500 - (y + 1) * 9000 / img->h());
	add_vertex(startx * 9000 / img->w() + 1000, 9500 - (y + 1) * 9000 / img->h());
	add(END);
      }
    }

    // Free the colormap...
    delete[] colors;
  }

  img->release();

#ifdef DEBUG
{
  int i;
  printf("Icon File \"%s\":\n", ifile);
  for (i = 0; i < num_data_; i ++)
  {
    printf("    %d,\n", data_[i]);
  }
}
#endif // DEBUG

  return 0;
}